

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parallel_csv.cpp
# Opt level: O1

bool RunVariableBuffer(string *path,idx_t buffer_size,bool set_temp_dir,
                      ColumnDataCollection *ground_truth,string *add_parameters)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  char cVar4;
  byte bVar5;
  char cVar6;
  long *plVar7;
  undefined8 *puVar8;
  ColumnDataCollection *pCVar9;
  ostream *poVar10;
  long *plVar11;
  ulong *puVar12;
  idx_t iVar13;
  char cVar14;
  ulong uVar15;
  string error_message;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  variable_buffer_size_result;
  Connection multi_conn;
  DuckDB db;
  ulong *local_158;
  long local_150;
  ulong local_148;
  long lStack_140;
  _Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false> local_138;
  char *local_130;
  long local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  long *local_110;
  long *local_108;
  ulong *local_100;
  uint local_f8;
  undefined4 uStack_f4;
  ulong local_f0 [2];
  ulong *local_e0;
  long local_d8;
  ulong local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  Connection local_80 [32];
  DuckDB local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  duckdb::DuckDB::DuckDB(local_60,(char *)0x0,(DBConfig *)0x0);
  duckdb::Connection::Connection(local_80,local_60);
  if (set_temp_dir) {
    local_158 = &local_148;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"PRAGMA temp_directory=\'offload.tmp\'","");
    duckdb::Connection::Query((string *)&local_108);
    if (local_108 != (long *)0x0) {
      (**(code **)(*local_108 + 8))();
    }
    local_108 = (long *)0x0;
    if (local_158 != &local_148) {
      operator_delete(local_158);
    }
  }
  local_158 = &local_148;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_158,"SET preserve_insertion_order=false;","");
  duckdb::Connection::Query((string *)&local_110);
  if (local_110 != (long *)0x0) {
    (**(code **)(*local_110 + 8))();
  }
  local_110 = (long *)0x0;
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  std::operator+(&local_50,"SELECT * FROM read_csv_auto(\'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)path);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
  plVar11 = plVar7 + 2;
  if ((long *)*plVar7 == plVar11) {
    local_b0 = *plVar11;
    lStack_a8 = plVar7[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *plVar11;
    local_c0 = (long *)*plVar7;
  }
  local_b8 = plVar7[1];
  *plVar7 = (long)plVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_c0,(ulong)(add_parameters->_M_dataplus)._M_p);
  plVar11 = plVar7 + 2;
  if ((long *)*plVar7 == plVar11) {
    local_90 = *plVar11;
    lStack_88 = plVar7[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar11;
    local_a0 = (long *)*plVar7;
  }
  local_98 = plVar7[1];
  *plVar7 = (long)plVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_a0);
  puVar12 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar12) {
    local_d0 = *puVar12;
    lStack_c8 = plVar7[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *puVar12;
    local_e0 = (ulong *)*plVar7;
  }
  local_d8 = plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  cVar6 = '\x01';
  if (9 < buffer_size) {
    iVar13 = buffer_size;
    cVar14 = '\x04';
    do {
      cVar6 = cVar14;
      if (iVar13 < 100) {
        cVar6 = cVar6 + -2;
        goto LAB_003fe262;
      }
      if (iVar13 < 1000) {
        cVar6 = cVar6 + -1;
        goto LAB_003fe262;
      }
      if (iVar13 < 10000) goto LAB_003fe262;
      bVar3 = 99999 < iVar13;
      iVar13 = iVar13 / 10000;
      cVar14 = cVar6 + '\x04';
    } while (bVar3);
    cVar6 = cVar6 + '\x01';
  }
LAB_003fe262:
  local_100 = local_f0;
  std::__cxx11::string::_M_construct((ulong)&local_100,cVar6);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_100,local_f8,buffer_size);
  uVar2 = CONCAT44(uStack_f4,local_f8) + local_d8;
  uVar15 = 0xf;
  if (local_e0 != &local_d0) {
    uVar15 = local_d0;
  }
  if (uVar15 < uVar2) {
    uVar15 = 0xf;
    if (local_100 != local_f0) {
      uVar15 = local_f0[0];
    }
    if (uVar15 < uVar2) goto LAB_003fe2d5;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,(ulong)local_e0);
  }
  else {
LAB_003fe2d5:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_100);
  }
  local_130 = (char *)&local_120;
  pcVar1 = (char *)(puVar8 + 2);
  if ((char *)*puVar8 == pcVar1) {
    local_120 = *(undefined8 *)pcVar1;
    uStack_118 = puVar8[3];
  }
  else {
    local_120 = *(undefined8 *)pcVar1;
    local_130 = (char *)*puVar8;
  }
  local_128 = puVar8[1];
  *puVar8 = pcVar1;
  puVar8[1] = 0;
  *pcVar1 = '\0';
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_130);
  local_158 = &local_148;
  puVar12 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar12) {
    local_148 = *puVar12;
    lStack_140 = plVar7[3];
  }
  else {
    local_148 = *puVar12;
    local_158 = (ulong *)*plVar7;
  }
  local_150 = plVar7[1];
  *plVar7 = (long)puVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  duckdb::Connection::Query((string *)&local_138);
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  if (local_130 != (char *)&local_120) {
    operator_delete(local_130);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                *)&local_138);
  bVar5 = duckdb::BaseQueryResult::HasError();
  if (bVar5 == 0) {
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_138);
    pCVar9 = (ColumnDataCollection *)duckdb::MaterializedQueryResult::Collection();
  }
  else {
    pCVar9 = (ColumnDataCollection *)0x0;
  }
  cVar6 = '\x01';
  if ((ground_truth == (ColumnDataCollection *)0x0 & bVar5) == 0) {
    if (ground_truth == (ColumnDataCollection *)0x0) {
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(path->_M_dataplus)._M_p,path->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10," Failed on max buffer but succeeded on variable buffer reading",0x3e);
      local_158 = (ulong *)CONCAT71(local_158._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_158,1);
    }
    else {
      if (bVar5 == 0) {
        local_158 = &local_148;
        local_150 = 0;
        local_148 = local_148 & 0xffffffffffffff00;
        cVar6 = duckdb::ColumnDataCollection::ResultEquals
                          (ground_truth,pCVar9,(string *)&local_158,false);
        if (cVar6 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"truth: ",7);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"resul: ",7);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(path->_M_dataplus)._M_p,path->_M_string_length
                              );
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," Buffer Size: ",0xe);
          cVar14 = '\x01';
          if (9 < buffer_size) {
            iVar13 = buffer_size;
            cVar4 = '\x04';
            do {
              cVar14 = cVar4;
              if (iVar13 < 100) {
                cVar14 = cVar14 + -2;
                goto LAB_003fe7b2;
              }
              if (iVar13 < 1000) {
                cVar14 = cVar14 + -1;
                goto LAB_003fe7b2;
              }
              if (iVar13 < 10000) goto LAB_003fe7b2;
              bVar3 = 99999 < iVar13;
              iVar13 = iVar13 / 10000;
              cVar4 = cVar14 + '\x04';
            } while (bVar3);
            cVar14 = cVar14 + '\x01';
          }
LAB_003fe7b2:
          local_130 = (char *)&local_120;
          std::__cxx11::string::_M_construct((ulong)&local_130,cVar14);
          std::__detail::__to_chars_10_impl<unsigned_long>(local_130,(uint)local_128,buffer_size);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_130,local_128);
          local_e0 = (ulong *)CONCAT71(local_e0._1_7_,10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_e0,1);
          if (local_130 != (char *)&local_120) {
            operator_delete(local_130);
          }
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,(char *)local_158,local_150);
          local_130 = (char *)CONCAT71(local_130._1_7_,10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_130,1);
        }
        if (local_158 != &local_148) {
          operator_delete(local_158);
        }
        goto LAB_003fe858;
      }
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(path->_M_dataplus)._M_p,path->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," Variable Buffer failed",0x17);
      local_158 = (ulong *)CONCAT71(local_158._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_158,1);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(path->_M_dataplus)._M_p,path->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," Buffer Size: ",0xe);
      cVar6 = '\x01';
      if (9 < buffer_size) {
        iVar13 = buffer_size;
        cVar14 = '\x04';
        do {
          cVar6 = cVar14;
          if (iVar13 < 100) {
            cVar6 = cVar6 + -2;
            goto LAB_003fe710;
          }
          if (iVar13 < 1000) {
            cVar6 = cVar6 + -1;
            goto LAB_003fe710;
          }
          if (iVar13 < 10000) goto LAB_003fe710;
          bVar3 = 99999 < iVar13;
          iVar13 = iVar13 / 10000;
          cVar14 = cVar6 + '\x04';
        } while (bVar3);
        cVar6 = cVar6 + '\x01';
      }
LAB_003fe710:
      local_158 = &local_148;
      std::__cxx11::string::_M_construct((ulong)&local_158,cVar6);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_158,(uint)local_150,buffer_size);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,(char *)local_158,local_150);
      local_130 = (char *)CONCAT71(local_130._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_130,1);
      if (local_158 != &local_148) {
        operator_delete(local_158);
      }
      duckdb::
      unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
      ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                    *)&local_138);
      puVar8 = (undefined8 *)duckdb::BaseQueryResult::GetError_abi_cxx11_();
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)*puVar8,puVar8[1]);
      local_158 = (ulong *)CONCAT71(local_158._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_158,1);
    }
    cVar6 = '\0';
  }
LAB_003fe858:
  if (local_138._M_head_impl != (MaterializedQueryResult *)0x0) {
    (**(code **)(*(long *)local_138._M_head_impl + 8))();
  }
  duckdb::Connection::~Connection(local_80);
  duckdb::DuckDB::~DuckDB(local_60);
  return (bool)cVar6;
}

Assistant:

bool RunVariableBuffer(const string &path, idx_t buffer_size, bool set_temp_dir,
                       ColumnDataCollection *ground_truth = nullptr, const string &add_parameters = "") {
	DuckDB db(nullptr);
	Connection multi_conn(db);
	if (set_temp_dir) {
		multi_conn.Query("PRAGMA temp_directory='offload.tmp'");
	}
	multi_conn.Query("SET preserve_insertion_order=false;");
	duckdb::unique_ptr<MaterializedQueryResult> variable_buffer_size_result =
	    multi_conn.Query("SELECT * FROM read_csv_auto('" + path + "'" + add_parameters +
	                     ", buffer_size = " + to_string(buffer_size) + ") ORDER BY ALL");
	bool variable_buffer_size_passed;
	ColumnDataCollection *result = nullptr;
	if (variable_buffer_size_result->HasError()) {
		variable_buffer_size_passed = false;
	} else {
		variable_buffer_size_passed = true;
		result = &variable_buffer_size_result->Collection();
	}
	if (!ground_truth && !variable_buffer_size_passed) {
		// Two wrongs can make a right
		return true;
	}
	if (!ground_truth) {
		//! oh oh, this should not pass
		std::cout << path << " Failed on max buffer but succeeded on variable buffer reading" << '\n';
		return false;
	}
	if (!variable_buffer_size_passed) {
		std::cout << path << " Variable Buffer failed" << '\n';
		std::cout << path << " Buffer Size: " << to_string(buffer_size) << '\n';
		std::cout << variable_buffer_size_result->GetError() << '\n';
		return false;
	}
	// Results do not match
	string error_message;
	if (!ColumnDataCollection::ResultEquals(*ground_truth, *result, error_message, false)) {
		std::cout << "truth: " << ground_truth->Count() << std::endl;
		std::cout << "resul: " << result->Count() << std::endl;

		std::cout << path << " Buffer Size: " << to_string(buffer_size) << '\n';
		std::cout << error_message << '\n';
		return false;
	}
	return true;
}